

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_loop_restoration_dealloc(AV1LrSync *lr_sync)

{
  void *in_RDI;
  LRWorkerData *workerdata_data;
  int worker_idx;
  int i;
  int j;
  void *in_stack_ffffffffffffffe0;
  int local_14;
  int local_10;
  int local_c;
  
  if (in_RDI != (void *)0x0) {
    for (local_c = 0; local_c < 3; local_c = local_c + 1) {
      if (*(long *)((long)in_RDI + (long)local_c * 8) != 0) {
        for (local_10 = 0; local_10 < *(int *)((long)in_RDI + 0x4c); local_10 = local_10 + 1) {
          pthread_mutex_destroy
                    ((pthread_mutex_t *)
                     (*(long *)((long)in_RDI + (long)local_c * 8) + (long)local_10 * 0x28));
        }
        aom_free(in_stack_ffffffffffffffe0);
      }
      if (*(long *)((long)in_RDI + (long)local_c * 8 + 0x18) != 0) {
        for (local_10 = 0; local_10 < *(int *)((long)in_RDI + 0x4c); local_10 = local_10 + 1) {
          pthread_cond_destroy
                    ((pthread_cond_t *)
                     (*(long *)((long)in_RDI + (long)local_c * 8 + 0x18) + (long)local_10 * 0x30));
        }
        aom_free(in_stack_ffffffffffffffe0);
      }
    }
    if (*(long *)((long)in_RDI + 0x58) != 0) {
      pthread_mutex_destroy(*(pthread_mutex_t **)((long)in_RDI + 0x58));
      aom_free(in_stack_ffffffffffffffe0);
    }
    for (local_c = 0; local_c < 3; local_c = local_c + 1) {
      aom_free(in_stack_ffffffffffffffe0);
    }
    aom_free(in_stack_ffffffffffffffe0);
    if (*(long *)((long)in_RDI + 0x60) != 0) {
      for (local_14 = 0; local_14 < *(int *)((long)in_RDI + 0x54) + -1; local_14 = local_14 + 1) {
        in_stack_ffffffffffffffe0 =
             (void *)(*(long *)((long)in_RDI + 0x60) + (long)local_14 * 0x1c0);
        aom_free(in_stack_ffffffffffffffe0);
        aom_free(in_stack_ffffffffffffffe0);
      }
      aom_free(in_stack_ffffffffffffffe0);
    }
    memset(in_RDI,0,0x80);
  }
  return;
}

Assistant:

void av1_loop_restoration_dealloc(AV1LrSync *lr_sync) {
  if (lr_sync != NULL) {
    int j;
#if CONFIG_MULTITHREAD
    int i;
    for (j = 0; j < MAX_MB_PLANE; j++) {
      if (lr_sync->mutex_[j] != NULL) {
        for (i = 0; i < lr_sync->rows; ++i) {
          pthread_mutex_destroy(&lr_sync->mutex_[j][i]);
        }
        aom_free(lr_sync->mutex_[j]);
      }
      if (lr_sync->cond_[j] != NULL) {
        for (i = 0; i < lr_sync->rows; ++i) {
          pthread_cond_destroy(&lr_sync->cond_[j][i]);
        }
        aom_free(lr_sync->cond_[j]);
      }
    }
    if (lr_sync->job_mutex != NULL) {
      pthread_mutex_destroy(lr_sync->job_mutex);
      aom_free(lr_sync->job_mutex);
    }
#endif  // CONFIG_MULTITHREAD
    for (j = 0; j < MAX_MB_PLANE; j++) {
      aom_free(lr_sync->cur_sb_col[j]);
    }

    aom_free(lr_sync->job_queue);

    if (lr_sync->lrworkerdata) {
      for (int worker_idx = 0; worker_idx < lr_sync->num_workers - 1;
           worker_idx++) {
        LRWorkerData *const workerdata_data =
            lr_sync->lrworkerdata + worker_idx;

        aom_free(workerdata_data->rst_tmpbuf);
        aom_free(workerdata_data->rlbs);
      }
      aom_free(lr_sync->lrworkerdata);
    }

    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*lr_sync);
  }
}